

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

ssize_t __thiscall
booster::locale::basic_message<wchar_t>::write
          (basic_message<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  wchar_t *__s;
  size_t sVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  wostream *pwVar4;
  string_type buffer;
  locale local_40;
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_28 [4];
  
  pwVar4 = (wostream *)CONCAT44(in_register_00000034,__fd);
  std::locale::locale(&local_40,(locale *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xd0));
  booster::locale::ios_info::get((ios_base *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18)));
  uVar1 = booster::locale::ios_info::domain_id();
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  __s = (wchar_t *)write(this,(int)&local_40,(void *)(ulong)uVar1,(size_t)&local_38);
  if (__s == (wchar_t *)0x0) {
    std::wios::clear(__fd + (int)*(undefined8 *)(*(long *)pwVar4 + -0x18));
  }
  else {
    sVar2 = wcslen(__s);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,__s,sVar2);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  sVar3 = std::locale::~locale(&local_40);
  return sVar3;
}

Assistant:

void write(std::basic_ostream<char_type> &out) const
            {
                std::locale const &loc = out.getloc();
                int id = ios_info::get(out).domain_id();
                string_type buffer;
                out << write(loc,id,buffer);
            }